

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

void UpnpRemoveAllVirtualDirs(void)

{
  virtual_Dir_List *pvVar1;
  virtualDirList *pNext;
  virtualDirList *pCur;
  
  if (UpnpSdkInit == 1) {
    pNext = pVirtualDirList;
    while (pNext != (virtualDirList *)0x0) {
      pvVar1 = pNext->next;
      free(pNext);
      pNext = pvVar1;
    }
    pVirtualDirList = (virtualDirList *)0x0;
  }
  return;
}

Assistant:

void UpnpRemoveAllVirtualDirs(void)
{
	virtualDirList *pCur;
	virtualDirList *pNext;

	if (UpnpSdkInit != 1) {
		return;
	}

	pCur = pVirtualDirList;

	while (pCur != NULL) {
		pNext = pCur->next;
		free(pCur);

		pCur = pNext;
	}

	pVirtualDirList = NULL;
}